

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_ed25519_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,EVP_PKEY **out_ctx)

{
  size_t *psVar1;
  int iVar2;
  EVP_PKEY *pEVar3;
  void *__dest;
  uchar *puVar4;
  byte *pbVar5;
  uint uVar6;
  char *pcVar7;
  size_t tmp_len;
  uchar *local_68;
  EVP_PKEY *local_60;
  size_t *local_58;
  uchar *buf;
  uchar *priv_key;
  uchar *pub_key;
  uchar *p;
  
  tmp_len = 0;
  iVar2 = _libssh2_get_string(decrypted,&pub_key,&tmp_len);
  if ((iVar2 != 0) || (tmp_len != 0x20)) {
    pcVar7 = "Wrong public key length";
LAB_00110294:
    _libssh2_error(session,-0xe,pcVar7);
    return -1;
  }
  iVar2 = _libssh2_get_string(decrypted,&priv_key,&tmp_len);
  if ((iVar2 != 0) || (tmp_len != 0x40)) {
    pcVar7 = "Wrong private key length";
    goto LAB_00110294;
  }
  local_58 = pubkeydata_len;
  pEVar3 = (EVP_PKEY *)EVP_PKEY_new_raw_private_key(0x43f,0,priv_key,0x20);
  iVar2 = _libssh2_get_string(decrypted,&buf,&tmp_len);
  if (iVar2 == 0) {
    local_60 = pEVar3;
    if ((tmp_len != 0) && (__dest = _libssh2_calloc(session,tmp_len + 1), __dest != (void *)0x0)) {
      memcpy(__dest,buf,tmp_len);
      *(undefined1 *)((long)__dest + tmp_len) = 0;
      (*session->free)(__dest,&session->abstract);
    }
    pEVar3 = local_60;
    pbVar5 = decrypted->dataptr;
    uVar6 = 1;
    while (pbVar5 < decrypted->data + decrypted->len) {
      if (uVar6 != *pbVar5) {
        pcVar7 = "Wrong padding";
        goto LAB_001103a7;
      }
      uVar6 = uVar6 + 1;
      pbVar5 = pbVar5 + 1;
      decrypted->dataptr = pbVar5;
    }
    puVar4 = (uchar *)(*session->alloc)(0xb,&session->abstract);
    if (puVar4 != (uchar *)0x0) {
      local_68 = (uchar *)_libssh2_calloc(session,0x33);
      if (local_68 != (uchar *)0x0) {
        p = local_68;
        _libssh2_store_str(&p,"ssh-ed25519",0xb);
        _libssh2_store_str(&p,(char *)pub_key,0x20);
        builtin_memcpy(puVar4,"ssh-ed25519",0xb);
        if (method == (uchar **)0x0) {
          (*session->free)(puVar4,&session->abstract);
        }
        else {
          *method = puVar4;
        }
        psVar1 = local_58;
        pEVar3 = local_60;
        if (method_len != (size_t *)0x0) {
          *method_len = 0xb;
        }
        if (pubkeydata == (uchar **)0x0) {
          (*session->free)(local_68,&session->abstract);
        }
        else {
          *pubkeydata = local_68;
        }
        if (psVar1 != (size_t *)0x0) {
          *psVar1 = 0x33;
        }
        if (out_ctx != (EVP_PKEY **)0x0) {
          *out_ctx = (EVP_PKEY *)pEVar3;
          return 0;
        }
        if (pEVar3 == (EVP_PKEY *)0x0) {
          return 0;
        }
        EVP_PKEY_free(pEVar3);
        return 0;
      }
      _libssh2_error(session,-6,"Unable to allocate memory for ED25519 key");
      goto LAB_001103b5;
    }
    pcVar7 = "Unable to allocate memory for ED25519 key";
    iVar2 = -6;
  }
  else {
    pcVar7 = "Unable to read comment";
LAB_001103a7:
    iVar2 = -0xe;
  }
  _libssh2_error(session,iVar2,pcVar7);
  puVar4 = (uchar *)0x0;
LAB_001103b5:
  if (pEVar3 != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(pEVar3);
  }
  if (puVar4 == (uchar *)0x0) {
    return -1;
  }
  (*session->free)(puVar4,&session->abstract);
  return -1;
}

Assistant:

static int
gen_publickey_from_ed25519_openssh_priv_data(LIBSSH2_SESSION *session,
                                             struct string_buf *decrypted,
                                             unsigned char **method,
                                             size_t *method_len,
                                             unsigned char **pubkeydata,
                                             size_t *pubkeydata_len,
                                             libssh2_ed25519_ctx **out_ctx)
{
    libssh2_ed25519_ctx *ctx = NULL;
    unsigned char *method_buf = NULL;
    unsigned char *key = NULL;
    int i, ret = 0;
    unsigned char *pub_key, *priv_key, *buf;
    size_t key_len = 0, tmp_len = 0;
    unsigned char *p;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ED25519 keys from private key data"));

    if(_libssh2_get_string(decrypted, &pub_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong public key length");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &priv_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_PRIVATE_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong private key length");
        ret = -1;
        goto clean_exit;
    }

    /* first 32 bytes of priv_key is the private key, the last 32 bytes are
       the public key */
    ctx = EVP_PKEY_new_raw_private_key(EVP_PKEY_ED25519, NULL,
                                       (const unsigned char *)priv_key,
                                       LIBSSH2_ED25519_KEY_LEN);

    /* comment */
    if(_libssh2_get_string(decrypted, &buf, &tmp_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Unable to read comment");
        ret = -1;
        goto clean_exit;
    }

    if(tmp_len > 0) {
        unsigned char *comment = LIBSSH2_CALLOC(session, tmp_len + 1);
        if(comment) {
            memcpy(comment, buf, tmp_len);
            memcpy(comment + tmp_len, "\0", 1);

            _libssh2_debug((session, LIBSSH2_TRACE_AUTH, "Key comment: %s",
                           comment));

            LIBSSH2_FREE(session, comment);
        }
    }

    /* Padding */
    i = 1;
    while(decrypted->dataptr < decrypted->data + decrypted->len) {
        if(*decrypted->dataptr != i) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "Wrong padding");
            ret = -1;
            goto clean_exit;
        }
        i++;
        decrypted->dataptr++;
    }

    if(ret == 0) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Computing public key from ED25519 "
                       "private key envelope"));

        method_buf = LIBSSH2_ALLOC(session, 11);  /* ssh-ed25519. */
        if(!method_buf) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        /* Key form is: type_len(4) + type(11) + pub_key_len(4) +
           pub_key(32). */
        key_len = LIBSSH2_ED25519_KEY_LEN + 19;
        key = LIBSSH2_CALLOC(session, key_len);
        if(!key) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        p = key;

        _libssh2_store_str(&p, "ssh-ed25519", 11);
        _libssh2_store_str(&p, (const char *)pub_key, LIBSSH2_ED25519_KEY_LEN);

        memcpy(method_buf, "ssh-ed25519", 11);

        if(method)
            *method = method_buf;
        else
            LIBSSH2_FREE(session, method_buf);

        if(method_len)
            *method_len = 11;

        if(pubkeydata)
            *pubkeydata = key;
        else
            LIBSSH2_FREE(session, key);

        if(pubkeydata_len)
            *pubkeydata_len = key_len;

        if(out_ctx)
            *out_ctx = ctx;
        else if(ctx)
            _libssh2_ed25519_free(ctx);

        return 0;
    }

clean_exit:

    if(ctx)
        _libssh2_ed25519_free(ctx);

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    if(key)
        LIBSSH2_FREE(session, key);

    return -1;
}